

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O1

int x86SAR(uchar *stream,x86Reg reg,int num)

{
  bool bVar1;
  uchar *start;
  
  if ((char)(uchar)num != num) {
    __assert_fail("char(num) == num",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                  ,0x695,"int x86SAR(unsigned char *, x86Reg, int)");
  }
  bVar1 = 8 < (int)reg;
  if (bVar1) {
    *stream = 8 < (int)reg | 0x40;
  }
  stream[bVar1] = 0xc1;
  stream[(ulong)bVar1 + 1] = regCode[reg] | 0xf8;
  stream[(ulong)bVar1 + 2] = (uchar)num;
  return bVar1 + 3;
}

Assistant:

int x86SAR(unsigned char *stream, x86Reg reg, int num)
{
	unsigned char *start = stream;

	assert(char(num) == num);

	stream += encodeRex(stream, false, rNONE, rNONE, reg);
	*stream++ = 0xc1;
	*stream++ = encodeRegister(reg, 7);
	stream += encodeImmByte(stream, (char)num);

	return int(stream - start);
}